

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpEndpointName.cpp
# Opt level: O2

void __thiscall IpEndpointName::AddressAndPortAsString(IpEndpointName *this,char *s)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = this->address;
  uVar3 = (uint)(uVar1 >> 8);
  uVar2 = (uint)(uVar1 >> 0x10);
  if (this->port == 0xffffffff) {
    if (uVar1 == 0xffffffff) {
      builtin_strncpy(s,"<any>:<any>",0xc);
      return;
    }
    sprintf(s,"%d.%d.%d.%d:<any>",uVar1 >> 0x18 & 0xff,(ulong)(uVar2 & 0xff),(ulong)(uVar3 & 0xff),
            (ulong)((uint)uVar1 & 0xff));
    return;
  }
  if (uVar1 == 0xffffffff) {
    sprintf(s,"<any>:%d");
    return;
  }
  sprintf(s,"%d.%d.%d.%d:%d",uVar1 >> 0x18 & 0xff,(ulong)(uVar2 & 0xff),(ulong)(uVar3 & 0xff),
          (ulong)((uint)uVar1 & 0xff),(ulong)(uint)this->port);
  return;
}

Assistant:

void IpEndpointName::AddressAndPortAsString( char *s ) const
{
	if( port == ANY_PORT ){
		if( address == ANY_ADDRESS ){
			std::sprintf( s, "<any>:<any>" );
		}else{
			std::sprintf( s, "%d.%d.%d.%d:<any>",
				(int)((address >> 24) & 0xFF),
				(int)((address >> 16) & 0xFF),
				(int)((address >> 8) & 0xFF),
				(int)(address & 0xFF) );
		}
	}else{
		if( address == ANY_ADDRESS ){
			std::sprintf( s, "<any>:%d", port );
		}else{
			std::sprintf( s, "%d.%d.%d.%d:%d",
				(int)((address >> 24) & 0xFF),
				(int)((address >> 16) & 0xFF),
				(int)((address >> 8) & 0xFF),
				(int)(address & 0xFF),
				(int)port );
		}
	}	
}